

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void clask::serve_dir(response_writer *resp,request *req,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  ulong uVar3;
  int iVar4;
  char cVar5;
  path *ppVar6;
  long lVar7;
  ostream *poVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  path *__p;
  string fn;
  wstring wpath;
  ostringstream os;
  path local_270;
  directory_iterator local_248;
  directory_iterator local_238;
  string local_228;
  string local_208;
  string local_1e8;
  wstring local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  to_wstring(&local_1c8,path);
  resp->code = 200;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"content-type","");
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"text/html; charset=utf-8","")
  ;
  response_writer::set_header(resp,&local_1e8,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "<!DOCTYPE html>\n<html>\n<head>\n<meta charset=\"UTF-8\">\n<title>",0x3c);
  html_encode(&local_270._M_pathname,&req->uri);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_270._M_pathname._M_dataplus._M_p,
             local_270._M_pathname._M_string_length);
  paVar1 = &local_270._M_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_pathname._M_dataplus._M_p,
                    local_270._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"</title>\n</head>\n<body>\n",0x18);
  std::__cxx11::stringbuf::str();
  (**resp->_vptr_response_writer)(resp,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_pathname._M_dataplus._M_p,
                    local_270._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_270._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_pathname._M_dataplus._M_p,
                    local_270._M_pathname.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (int)(ostream *)local_1a8;
  std::ios::clear((int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + iVar4);
  std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
            (&local_270,&local_1c8,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_238,&local_270,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_270);
  if (local_238._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_238._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_238._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_238._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_238._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_248._M_dir._M_ptr = local_238._M_dir._M_ptr;
  local_248._M_dir._M_refcount._M_pi = local_238._M_dir._M_refcount._M_pi;
  if (local_238._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_238._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_238._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_238._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_238._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
    if (local_238._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_238._M_dir._M_refcount._M_pi);
    }
  }
  do {
    if (local_248._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (local_238._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_238._M_dir._M_refcount._M_pi);
      }
      local_270._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"</body>\n</html>\n","");
      (**resp->_vptr_response_writer)(resp,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_pathname._M_dataplus._M_p,
                        local_270._M_pathname.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity * 4 + 4);
      }
      return;
    }
    ppVar6 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_248);
    sVar2 = (ppVar6->_M_pathname)._M_string_length;
    if (sVar2 == 0) {
LAB_0010ca07:
      std::filesystem::__cxx11::path::path(&local_270);
    }
    else {
      uVar3 = *(ulong *)&ppVar6->_M_cmpts;
      __p = ppVar6;
      if ((~(byte)uVar3 & 3) != 0) {
        if (((uVar3 & 3) == 0) && ((ppVar6->_M_pathname)._M_dataplus._M_p[sVar2 - 1] != '/')) {
          if ((uVar3 & 3) == 0) {
            lVar7 = std::filesystem::__cxx11::path::_List::end();
          }
          else {
            lVar7 = 0;
          }
          if (((byte)ppVar6->_M_cmpts & 3) == 0) {
            __p = (path *)(lVar7 + -0x30);
          }
          if ((~*(uint *)&__p->_M_cmpts & 3) == 0) goto LAB_0010c9fd;
        }
        goto LAB_0010ca07;
      }
LAB_0010c9fd:
      std::filesystem::__cxx11::path::path(&local_270,__p);
    }
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,local_270._M_pathname._M_dataplus._M_p,
               local_270._M_pathname._M_dataplus._M_p + local_270._M_pathname._M_string_length);
    std::filesystem::__cxx11::path::~path(&local_270);
    cVar5 = *(char *)&ppVar6[1]._M_pathname._M_dataplus._M_p;
    if ((cVar5 == '\x03') || (cVar5 == '\0')) {
      cVar5 = std::filesystem::status(ppVar6);
    }
    if (cVar5 == '\x02') {
      std::__cxx11::string::append((char *)&local_208);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<a href=\"",9);
    url_encode(&local_270._M_pathname,&local_208,false);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_270._M_pathname._M_dataplus._M_p,
                        local_270._M_pathname._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\">",2);
    html_encode(&local_228,&local_208);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</a></br>\n",10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_pathname._M_dataplus._M_p,
                      local_270._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    (**resp->_vptr_response_writer)(resp,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_pathname._M_dataplus._M_p,
                      local_270._M_pathname.field_2._M_allocated_capacity + 1);
    }
    local_270._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_pathname._M_dataplus._M_p,
                      local_270._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::ios::clear((int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + iVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_248);
  } while( true );
}

Assistant:

inline void serve_dir(response_writer& resp, request& req, const std::string& path) {
  auto wpath = to_wstring(path);

  resp.code = 200;
  resp.set_header("content-type", "text/html; charset=utf-8");
  std::ostringstream os;
  os << "<!DOCTYPE html>\n<html>\n<head>\n<meta charset=\"UTF-8\">\n<title>";
  os << html_encode(req.uri);
  os << "</title>\n</head>\n<body>\n";
  resp.write(os.str());
  os.str("");
  os.clear(std::stringstream::goodbit);

  for (const auto& e : std::filesystem::directory_iterator(wpath)) {
    auto fn = e.path().filename().string();
    if (e.is_directory()) fn += "/";
    os << "<a href=\"" << url_encode(fn, false) << "\">" << html_encode(fn) << "</a></br>\n";
    resp.write(os.str());
    os.str("");
    os.clear(std::stringstream::goodbit);
  }
  resp.write("</body>\n</html>\n");
}